

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v10::detail::write_int_noinline<char,fmt::v10::appender,unsigned__int128>
                   (appender out,write_int_arg<unsigned___int128> arg,format_specs<char> *specs,
                   locale_ref loc)

{
  presentation_type pVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 n [16];
  undefined1 value [16];
  undefined1 uVar4;
  undefined2 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  uint uVar9;
  char *digits;
  appender aVar10;
  long lVar11;
  byte *pbVar12;
  char *pcVar13;
  uint uVar14;
  char *digits_1;
  ulong uVar15;
  char *pcVar16;
  char *pcVar17;
  detail *pdVar18;
  int num_digits;
  long lVar19;
  long lVar20;
  bool bVar21;
  bool bVar22;
  format_decimal_result<char_*> fVar23;
  undefined8 in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  write_int_data<char> local_c8;
  anon_class_64_3_4ecd7a16 local_b8 [2];
  
  uVar7 = local_b8[0].write_digits.abs_value._7_4_;
  uVar6 = local_b8[0].write_digits.abs_value._3_4_;
  uVar5 = local_b8[0].write_digits.abs_value._1_2_;
  uVar4 = (undefined1)local_b8[0].write_digits.abs_value;
  pVar1 = specs->type;
  local_b8[0].write_digits.abs_value._11_5_ = arg.abs_value._11_5_;
  local_b8[0].write_digits.abs_value._0_1_ = (undefined1)arg.abs_value;
  local_b8[0].write_digits.abs_value._1_2_ = arg.abs_value._1_2_;
  local_b8[0].write_digits.abs_value._3_4_ = arg.abs_value._3_4_;
  local_b8[0].write_digits.abs_value._7_4_ = arg.abs_value._7_4_;
  uVar8 = local_b8[0].write_digits.abs_value._7_4_;
  switch(pVar1) {
  case none:
  case dec:
    n._8_8_ = in_stack_ffffffffffffff30;
    n._0_8_ = in_stack_ffffffffffffff28;
    local_b8[0].write_digits.abs_value._7_4_ = uVar7;
    local_b8[0].write_digits.num_digits =
         count_digits_fallback<unsigned__int128>((detail *)arg.abs_value,(unsigned___int128)n);
    if (specs->precision != -1 || specs->width != 0) {
      write_int_data<char>::write_int_data
                (&local_c8,local_b8[0].write_digits.num_digits,arg.prefix,specs);
      local_b8[0].prefix = arg.prefix;
      local_b8[0].data.size = local_c8.size;
      local_b8[0].data.padding = local_c8.padding;
      local_b8[0].write_digits.abs_value._7_4_ = uVar8;
      aVar10 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_int<fmt::v10::appender,char,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned__int128>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned__int128>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_1_>(fmt::v10::appender,int,unsigned_int,fmt::v10::format_specs<char>const&,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned__int128>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned__int128>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_1_)::_lambda(fmt::v10::appender)_1_&>
                         (out,specs,local_c8.size,local_c8.size,(anon_class_64_3_4ecd7a16 *)local_b8
                         );
      return (appender)
             aVar10.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
    }
    if (local_b8[0].write_digits.num_digits < 0) {
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/fmt/include/fmt/core.h"
                  ,0x17a,"negative value");
    }
    if ((arg.prefix != 0) &&
       (uVar14 = arg.prefix & 0xffffff,
       ((undefined1  [32])arg & (undefined1  [32])0xffffff) != (undefined1  [32])0x0)) {
      do {
        if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                             container + 0x18) <
            *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                            container + 0x10) + 1U) {
          (*(code *)**(undefined8 **)
                      out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
                    (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
        }
        lVar19 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                 container + 0x10);
        *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                 0x10) = lVar19 + 1;
        *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                  container + 8) + lVar19) = (char)uVar14;
        bVar21 = 0xff < uVar14;
        uVar14 = uVar14 >> 8;
      } while (bVar21);
    }
    local_b8[0].data.padding = 0;
    local_b8[0]._24_3_ = 0;
    local_b8[0]._27_4_ = 0;
    local_b8[0].prefix = 0;
    local_b8[0]._4_4_ = 0;
    local_b8[0].data.size = 0;
    local_b8[0]._31_1_ = 0;
    local_b8[0].write_digits.abs_value._0_1_ = 0;
    local_b8[0].write_digits.abs_value._1_2_ = 0;
    local_b8[0].write_digits.abs_value._3_4_ = 0;
    value._8_8_ = in_stack_ffffffffffffff30;
    value._0_8_ = in_stack_ffffffffffffff28;
    fVar23 = format_decimal<char,unsigned__int128>
                       ((detail *)local_b8,(char *)(detail *)arg.abs_value,(unsigned___int128)value,
                        arg.abs_value._8_4_);
    pcVar13 = fVar23.end;
    break;
  case oct:
    uVar15 = arg.abs_value._8_8_;
    pdVar18 = (detail *)arg.abs_value;
    lVar19 = 0;
    do {
      lVar20 = lVar19;
      uVar2 = uVar15 << 0x3d;
      lVar19 = lVar20 + 1;
      bVar21 = (detail *)0x7 < pdVar18;
      bVar22 = uVar15 != 0;
      uVar3 = -uVar15;
      uVar15 = uVar15 >> 3;
      pdVar18 = (detail *)(uVar2 | (ulong)pdVar18 >> 3);
    } while (bVar22 || uVar3 < bVar21);
    num_digits = (int)lVar19;
    if (((specs->field_0x9 & 0x80) != 0) &&
       (((detail *)arg.abs_value != (detail *)0x0 || arg.abs_value._8_8_ != 0) &&
        specs->precision <= num_digits)) {
      uVar14 = 0x3000;
      if (arg.prefix == 0) {
        uVar14 = 0x30;
      }
      arg.prefix = (uVar14 | arg.prefix) + 0x1000000;
    }
    if (specs->precision != -1 || specs->width != 0) {
      write_int_data<char>::write_int_data(&local_c8,num_digits,arg.prefix,specs);
      local_b8[0].prefix = arg.prefix;
      local_b8[0].data.size = local_c8.size;
      local_b8[0].data.padding = local_c8.padding;
      local_b8[0].write_digits.num_digits = num_digits;
      aVar10 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_int<fmt::v10::appender,char,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned__int128>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned__int128>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_4_>(fmt::v10::appender,int,unsigned_int,fmt::v10::format_specs<char>const&,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned__int128>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned__int128>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_4_)::_lambda(fmt::v10::appender)_1_&>
                         (out,specs,local_c8.size,local_c8.size,(anon_class_64_3_4ecd7a16 *)local_b8
                         );
      return (appender)
             aVar10.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
    }
    if ((arg.prefix != 0) && (uVar14 = arg.prefix & 0xffffff, (arg.prefix & 0xffffff) != 0)) {
      do {
        if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                             container + 0x18) <
            *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                            container + 0x10) + 1U) {
          (*(code *)**(undefined8 **)
                      out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
                    (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
        }
        lVar11 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                 container + 0x10);
        *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                 0x10) = lVar11 + 1;
        *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                  container + 8) + lVar11) = (char)uVar14;
        bVar21 = 0xff < uVar14;
        uVar14 = uVar14 >> 8;
      } while (bVar21);
    }
    lVar11 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                             container + 0x10);
    uVar15 = lVar11 + lVar19;
    if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                  0x18) < uVar15) {
      lVar11 = 0;
    }
    else {
      *(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                0x10) = uVar15;
      lVar11 = lVar11 + *(long *)((long)out.
                                        super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                        container + 8);
    }
    if (lVar11 != 0) {
      pbVar12 = (byte *)(lVar11 + lVar19);
      do {
        pbVar12 = pbVar12 + -1;
        uVar15 = arg.abs_value._8_8_ << 0x3d;
        *pbVar12 = (byte)(detail *)arg.abs_value & 7 | 0x30;
        bVar21 = ((detail *)arg.abs_value < (detail *)0x8) <= arg.abs_value._8_8_;
        arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 3;
        arg.abs_value._0_8_ = (detail *)(uVar15 | (ulong)(detail *)arg.abs_value >> 3);
      } while (bVar21);
      return (appender)
             out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
    }
    pbVar12 = (byte *)((long)&local_b8[0].prefix + lVar20);
    local_b8[0].write_digits.abs_value._0_1_ = 0;
    local_b8[0].write_digits.abs_value._1_2_ = 0;
    local_b8[0].write_digits.abs_value._3_4_ = 0;
    local_b8[0].write_digits.abs_value._7_4_ = 0;
    local_b8[0].data.padding = 0;
    local_b8[0]._24_3_ = 0;
    local_b8[0]._27_4_ = 0;
    local_b8[0]._31_1_ = 0;
    local_b8[0].prefix = 0;
    local_b8[0]._4_4_ = 0;
    local_b8[0].data.size = 0;
    pcVar13 = (char *)((long)&local_b8[0].prefix + lVar20 + 1);
    do {
      *pbVar12 = (byte)(detail *)arg.abs_value & 7 | 0x30;
      uVar15 = arg.abs_value._8_8_ << 0x3d;
      pbVar12 = pbVar12 + -1;
      bVar21 = (detail *)0x7 < (detail *)arg.abs_value;
      bVar22 = arg.abs_value._8_8_ != 0;
      uVar2 = -arg.abs_value._8_8_;
      arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 3;
      arg.abs_value._0_8_ = (detail *)(uVar15 | (ulong)(detail *)arg.abs_value >> 3);
    } while (bVar22 || uVar2 < bVar21);
    break;
  case hex_lower:
  case hex_upper:
    if ((specs->field_0x9 & 0x80) != 0) {
      uVar9 = (uint)(pVar1 != hex_upper) << 0xd | 0x5830;
      uVar14 = uVar9 << 8;
      if (arg.prefix == 0) {
        uVar14 = uVar9;
      }
      arg.prefix = (uVar14 | arg.prefix) + 0x2000000;
    }
    uVar15 = arg.abs_value._8_8_;
    pdVar18 = (detail *)arg.abs_value;
    lVar19 = 0;
    do {
      lVar20 = lVar19;
      uVar2 = uVar15 << 0x3c;
      lVar19 = lVar20 + 1;
      bVar21 = (detail *)0xf < pdVar18;
      bVar22 = uVar15 != 0;
      uVar3 = -uVar15;
      uVar15 = uVar15 >> 4;
      pdVar18 = (detail *)(uVar2 | (ulong)pdVar18 >> 4);
    } while (bVar22 || uVar3 < bVar21);
    if (specs->precision != -1 || specs->width != 0) {
      write_int_data<char>::write_int_data(&local_c8,(int)lVar19,arg.prefix,specs);
      local_b8[0].prefix = arg.prefix;
      local_b8[0].data.size = local_c8.size;
      local_b8[0].data.padding = local_c8.padding;
      local_b8[0].write_digits.num_digits = (int)lVar19;
      local_b8[0].write_digits.upper = pVar1 == hex_upper;
      aVar10 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_int<fmt::v10::appender,char,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned__int128>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned__int128>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_2_>(fmt::v10::appender,int,unsigned_int,fmt::v10::format_specs<char>const&,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned__int128>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned__int128>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_2_)::_lambda(fmt::v10::appender)_1_&>
                         (out,specs,local_c8.size,local_c8.size,local_b8);
      return (appender)
             aVar10.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
    }
    local_b8[0].write_digits.abs_value._1_2_ = uVar5;
    local_b8[0].write_digits.abs_value._3_4_ = uVar6;
    local_b8[0].write_digits.abs_value._7_4_ = uVar7;
    if ((arg.prefix != 0) && (uVar14 = arg.prefix & 0xffffff, (arg.prefix & 0xffffff) != 0)) {
      do {
        if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                             container + 0x18) <
            *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                            container + 0x10) + 1U) {
          (*(code *)**(undefined8 **)
                      out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
                    (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
        }
        lVar11 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                 container + 0x10);
        *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                 0x10) = lVar11 + 1;
        *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                  container + 8) + lVar11) = (char)uVar14;
        bVar21 = 0xff < uVar14;
        uVar14 = uVar14 >> 8;
      } while (bVar21);
    }
    lVar11 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                             container + 0x10);
    uVar15 = lVar11 + lVar19;
    if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                  0x18) < uVar15) {
      lVar11 = 0;
    }
    else {
      *(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                0x10) = uVar15;
      lVar11 = lVar11 + *(long *)((long)out.
                                        super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                        container + 8);
    }
    if (lVar11 != 0) {
      pcVar13 = "0123456789abcdef";
      if (pVar1 == hex_upper) {
        pcVar13 = "0123456789ABCDEF";
      }
      pcVar16 = (char *)(lVar11 + lVar19);
      do {
        pcVar16 = pcVar16 + -1;
        uVar15 = arg.abs_value._8_8_ << 0x3c;
        *pcVar16 = pcVar13[(uint)(detail *)arg.abs_value & 0xf];
        bVar21 = ((detail *)arg.abs_value < (detail *)0x10) <= arg.abs_value._8_8_;
        arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 4;
        arg.abs_value._0_8_ = (detail *)(uVar15 | (ulong)(detail *)arg.abs_value >> 4);
      } while (bVar21);
      return (appender)
             out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
    }
    pcVar16 = (char *)((long)&local_b8[0].prefix + lVar20);
    local_b8[0].data.padding = 0;
    local_b8[0]._24_3_ = 0;
    local_b8[0]._27_4_ = 0;
    local_b8[0]._31_1_ = 0;
    local_b8[0].prefix = 0;
    local_b8[0]._4_4_ = 0;
    local_b8[0].data.size = 0;
    local_b8[0].write_digits.abs_value._0_1_ = 0;
    pcVar13 = (char *)((long)&local_b8[0].prefix + lVar20 + 1);
    pcVar17 = "0123456789abcdef";
    if (pVar1 == hex_upper) {
      pcVar17 = "0123456789ABCDEF";
    }
    do {
      *pcVar16 = pcVar17[(uint)(detail *)arg.abs_value & 0xf];
      uVar15 = arg.abs_value._8_8_ << 0x3c;
      pcVar16 = pcVar16 + -1;
      bVar21 = (detail *)0xf < (detail *)arg.abs_value;
      bVar22 = arg.abs_value._8_8_ != 0;
      uVar2 = -arg.abs_value._8_8_;
      arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 4;
      arg.abs_value._0_8_ = (detail *)(uVar15 | (ulong)(detail *)arg.abs_value >> 4);
    } while (bVar22 || uVar2 < bVar21);
    break;
  case bin_lower:
  case bin_upper:
    if ((specs->field_0x9 & 0x80) != 0) {
      uVar9 = (uint)(pVar1 != bin_upper) << 0xd | 0x4230;
      uVar14 = uVar9 << 8;
      if (arg.prefix == 0) {
        uVar14 = uVar9;
      }
      arg.prefix = (uVar14 | arg.prefix) + 0x2000000;
    }
    uVar15 = arg.abs_value._8_8_;
    pdVar18 = (detail *)arg.abs_value;
    lVar19 = 0;
    do {
      lVar20 = lVar19;
      uVar2 = uVar15 << 0x3f;
      lVar19 = lVar20 + 1;
      bVar21 = (detail *)0x1 < pdVar18;
      bVar22 = uVar15 != 0;
      uVar3 = -uVar15;
      uVar15 = uVar15 >> 1;
      pdVar18 = (detail *)(uVar2 | (ulong)pdVar18 >> 1);
    } while (bVar22 || uVar3 < bVar21);
    if (specs->precision != -1 || specs->width != 0) {
      write_int_data<char>::write_int_data(&local_c8,(int)lVar19,arg.prefix,specs);
      local_b8[0].prefix = arg.prefix;
      local_b8[0].data.size = local_c8.size;
      local_b8[0].data.padding = local_c8.padding;
      local_b8[0].write_digits.num_digits = (int)lVar19;
      aVar10 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_int<fmt::v10::appender,char,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned__int128>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned__int128>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_3_>(fmt::v10::appender,int,unsigned_int,fmt::v10::format_specs<char>const&,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned__int128>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned__int128>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_3_)::_lambda(fmt::v10::appender)_1_&>
                         (out,specs,local_c8.size,local_c8.size,(anon_class_64_3_4ecd7a16 *)local_b8
                         );
      return (appender)
             aVar10.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
    }
    local_b8[0].write_digits.abs_value._0_1_ = uVar4;
    local_b8[0].write_digits.abs_value._1_2_ = uVar5;
    local_b8[0].write_digits.abs_value._3_4_ = uVar6;
    local_b8[0].write_digits.abs_value._7_4_ = uVar7;
    if ((arg.prefix != 0) && (uVar14 = arg.prefix & 0xffffff, (arg.prefix & 0xffffff) != 0)) {
      do {
        if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                             container + 0x18) <
            *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                            container + 0x10) + 1U) {
          (*(code *)**(undefined8 **)
                      out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
                    (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
        }
        lVar11 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                 container + 0x10);
        *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                 0x10) = lVar11 + 1;
        *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                  container + 8) + lVar11) = (char)uVar14;
        bVar21 = 0xff < uVar14;
        uVar14 = uVar14 >> 8;
      } while (bVar21);
    }
    lVar11 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                             container + 0x10);
    uVar15 = lVar11 + lVar19;
    if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                  0x18) < uVar15) {
      lVar11 = 0;
    }
    else {
      *(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                0x10) = uVar15;
      lVar11 = lVar11 + *(long *)((long)out.
                                        super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                        container + 8);
    }
    if (lVar11 != 0) {
      pbVar12 = (byte *)(lVar11 + lVar19);
      do {
        pbVar12 = pbVar12 + -1;
        uVar15 = arg.abs_value._8_8_ << 0x3f;
        *pbVar12 = (byte)(detail *)arg.abs_value & 1 | 0x30;
        bVar21 = ((detail *)arg.abs_value < (detail *)0x2) <= arg.abs_value._8_8_;
        arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 1;
        arg.abs_value._0_8_ = (detail *)(uVar15 | (ulong)(detail *)arg.abs_value >> 1);
      } while (bVar21);
      return (appender)
             out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
    }
    pbVar12 = (byte *)((long)&local_b8[0].prefix + lVar20);
    memset(local_b8,0,0x81);
    pcVar13 = (char *)((long)&local_b8[0].prefix + lVar20 + 1);
    do {
      *pbVar12 = (byte)(detail *)arg.abs_value & 1 | 0x30;
      uVar15 = arg.abs_value._8_8_ << 0x3f;
      pbVar12 = pbVar12 + -1;
      bVar21 = (detail *)0x1 < (detail *)arg.abs_value;
      bVar22 = arg.abs_value._8_8_ != 0;
      uVar2 = -arg.abs_value._8_8_;
      arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 1;
      arg.abs_value._0_8_ = (detail *)(uVar15 | (ulong)(detail *)arg.abs_value >> 1);
    } while (bVar22 || uVar2 < bVar21);
    break;
  default:
    throw_format_error("invalid format specifier");
  case chr:
    local_b8[0].prefix._1_1_ = (undefined1)local_b8[0].write_digits.abs_value;
    local_b8[0].prefix._0_1_ = pVar1 == debug;
    aVar10 = write_padded<(fmt::v10::align::type)1,fmt::v10::appender,char,fmt::v10::detail::write_char<char,fmt::v10::appender>(fmt::v10::appender,char,fmt::v10::format_specs<char>const&)::_lambda(fmt::v10::appender)_1_&>
                       (out,specs,1,1,(anon_class_2_2_bf5026b7 *)local_b8);
    return (appender)
           aVar10.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
  }
  aVar10 = copy_str_noinline<char,char*,fmt::v10::appender>((char *)local_b8,pcVar13,out);
  return (appender)
         aVar10.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR FMT_INLINE auto write_int(OutputIt out, write_int_arg<T> arg,
                                        const format_specs<Char>& specs,
                                        locale_ref) -> OutputIt {
  static_assert(std::is_same<T, uint32_or_64_or_128_t<T>>::value, "");
  auto abs_value = arg.abs_value;
  auto prefix = arg.prefix;
  switch (specs.type) {
  case presentation_type::none:
  case presentation_type::dec: {
    auto num_digits = count_digits(abs_value);
    return write_int(
        out, num_digits, prefix, specs, [=](reserve_iterator<OutputIt> it) {
          return format_decimal<Char>(it, abs_value, num_digits).end;
        });
  }
  case presentation_type::hex_lower:
  case presentation_type::hex_upper: {
    bool upper = specs.type == presentation_type::hex_upper;
    if (specs.alt)
      prefix_append(prefix, unsigned(upper ? 'X' : 'x') << 8 | '0');
    int num_digits = count_digits<4>(abs_value);
    return write_int(
        out, num_digits, prefix, specs, [=](reserve_iterator<OutputIt> it) {
          return format_uint<4, Char>(it, abs_value, num_digits, upper);
        });
  }
  case presentation_type::bin_lower:
  case presentation_type::bin_upper: {
    bool upper = specs.type == presentation_type::bin_upper;
    if (specs.alt)
      prefix_append(prefix, unsigned(upper ? 'B' : 'b') << 8 | '0');
    int num_digits = count_digits<1>(abs_value);
    return write_int(out, num_digits, prefix, specs,
                     [=](reserve_iterator<OutputIt> it) {
                       return format_uint<1, Char>(it, abs_value, num_digits);
                     });
  }
  case presentation_type::oct: {
    int num_digits = count_digits<3>(abs_value);
    // Octal prefix '0' is counted as a digit, so only add it if precision
    // is not greater than the number of digits.
    if (specs.alt && specs.precision <= num_digits && abs_value != 0)
      prefix_append(prefix, '0');
    return write_int(out, num_digits, prefix, specs,
                     [=](reserve_iterator<OutputIt> it) {
                       return format_uint<3, Char>(it, abs_value, num_digits);
                     });
  }
  case presentation_type::chr:
    return write_char(out, static_cast<Char>(abs_value), specs);
  default:
    throw_format_error("invalid format specifier");
  }
  return out;
}